

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O3

void aes_ni_setkey(ssh_cipher *ciph,void *vkey)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  ssh_cipher *psVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ssh_cipher *psVar13;
  undefined1 auVar14 [16];
  undefined8 uStack_130;
  uint local_128 [2];
  undefined8 auStack_120 [30];
  
  uVar2 = ciph->vt->real_keybits;
  uVar10 = uVar2 + 0x1f;
  if (-1 < (int)uVar2) {
    uVar10 = uVar2;
  }
  uVar12 = (ulong)((int)uVar10 >> 5);
  if (uVar12 * 4 != -0x1c) {
    uVar10 = 0;
    uVar6 = 0;
    do {
      if (uVar6 < uVar12) {
        uVar9 = *(uint *)((long)vkey + uVar6 * 4);
      }
      else {
        uVar9 = *(uint *)((long)&uStack_130 + uVar6 * 4 + 4);
        if (uVar6 % uVar12 == 0) {
          if (9 < uVar10) {
            uStack_130 = aes128_ni_cbc_encrypt;
            __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-ni.c"
                          ,0x52,
                          "void aes_ni_key_expand(const unsigned char *, size_t, __m128i *, __m128i *)"
                         );
          }
          auVar14 = aeskeygenassist(ZEXT416(uVar9) << 0x20,0);
          uVar8 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          uVar9 = (uint)aes_key_setup_round_constants[uVar8] ^ auVar14._4_4_;
        }
        else if (((uint)uVar6 & 7) == 4 && (uVar2 & 0xffffffe0) == 0x100) {
          auVar14 = aeskeygenassist(ZEXT416(uVar9) << 0x20,0);
          uVar9 = auVar14._0_4_;
        }
        uVar9 = uVar9 ^ *(uint *)((long)auStack_120 + uVar6 * 4 + uVar12 * -4 + -8);
      }
      *(uint *)((long)auStack_120 + uVar6 * 4 + -8) = uVar9;
      uVar6 = uVar6 + 1;
    } while (uVar12 * 4 + 0x1c != uVar6);
  }
  psVar13 = ciph + -0x3f;
  lVar11 = uVar12 + 7 + (ulong)(uVar12 == 0xfffffffffffffff9);
  lVar4 = 0;
  lVar7 = lVar11;
  do {
    uVar3 = *(undefined8 *)((long)auStack_120 + lVar4);
    puVar1 = (undefined8 *)((long)&psVar13->vt + lVar4);
    *puVar1 = *(undefined8 *)((long)auStack_120 + lVar4 + -8);
    puVar1[1] = uVar3;
    lVar4 = lVar4 + 0x10;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  uStack_130 = (code *)0x1599b5;
  smemclr(local_128,0xf0);
  psVar5 = ciph + uVar12 * 2 + -0x15;
  lVar7 = 0;
  do {
    auVar14 = *(undefined1 (*) [16])psVar13;
    if ((lVar7 != 0) && (uVar12 + 6 != lVar7)) {
      auVar14 = aesimc(auVar14);
    }
    *(undefined1 (*) [16])psVar5 = auVar14;
    lVar7 = lVar7 + 1;
    psVar13 = psVar13 + 2;
    psVar5 = psVar5 + -2;
  } while (lVar11 != lVar7);
  return;
}

Assistant:

static void aes_ni_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);
    const unsigned char *key = (const unsigned char *)vkey;

    aes_ni_key_expand(key, ctx->ciph.vt->real_keybits / 32,
                      ctx->keysched_e, ctx->keysched_d);
}